

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QRectF * setupTextLayout(QRectF *__return_storage_ptr__,QTextLayout *layout)

{
  double dVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  long extraout_RDX;
  qreal extraout_RDX_00;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  QPointF local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QTextLayout::setCacheEnabled(SUB81(layout,0));
  QTextLayout::beginLayout();
  do {
    QTextLayout::createLine();
  } while (extraout_RDX != 0);
  QTextLayout::endLayout();
  iVar2 = QTextLayout::lineCount();
  if (iVar2 < 1) {
    dVar5 = 0.0;
    dVar6 = 0.0;
  }
  else {
    dVar6 = 0.0;
    iVar2 = 0;
    dVar1 = 0.0;
    do {
      local_48.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      local_48.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      uVar3 = QTextLayout::lineAt((int)layout);
      local_48.xp = (qreal)CONCAT44(local_48.xp._4_4_,uVar3);
      local_48.yp = extraout_RDX_00;
      dVar5 = (double)QTextLine::naturalTextWidth();
      if (dVar5 <= dVar1) {
        dVar5 = dVar1;
      }
      QTextLine::setPosition(&local_48);
      dVar1 = (double)QTextLine::height();
      dVar6 = dVar1 + dVar6;
      iVar2 = iVar2 + 1;
      iVar4 = QTextLayout::lineCount();
      dVar1 = dVar5;
    } while (iVar2 < iVar4);
  }
  __return_storage_ptr__->xp = 0.0;
  __return_storage_ptr__->yp = 0.0;
  __return_storage_ptr__->w = dVar5;
  __return_storage_ptr__->h = dVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QRectF setupTextLayout(QTextLayout *layout)
{
    layout->setCacheEnabled(true);
    layout->beginLayout();
    while (layout->createLine().isValid())
        ;
    layout->endLayout();
    qreal maxWidth = 0;
    qreal y = 0;
    for (int i = 0; i < layout->lineCount(); ++i) {
        QTextLine line = layout->lineAt(i);
        maxWidth = qMax(maxWidth, line.naturalTextWidth());
        line.setPosition(QPointF(0, y));
        y += line.height();
    }
    return QRectF(0, 0, maxWidth, y);
}